

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O1

void random_cb(uv_random_t *req,int status,void *buf,size_t buflen)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  char zero [256];
  undefined1 auStack_320 [256];
  undefined1 auStack_220 [256];
  code *pcStack_120;
  undefined1 auStack_118 [256];
  
  pcStack_120 = (code *)0x168e4b;
  memset(auStack_118,0,0x100);
  iVar2 = random_cb_called;
  if (status == 0) {
    if ((char *)buf != scratch) goto LAB_00168ec1;
    if (random_cb_called != 0) {
      if (buflen == 0x100) {
        pcStack_120 = (code *)0x168e82;
        iVar1 = bcmp(scratch,auStack_118,0x100);
        if (iVar1 != 0) goto LAB_00168ea8;
        pcStack_120 = (code *)0x168e8b;
        random_cb_cold_4();
        goto LAB_00168e8b;
      }
      goto LAB_00168ec6;
    }
LAB_00168e8b:
    if (buflen != 0) goto LAB_00168ecb;
    pcStack_120 = (code *)0x168ea4;
    iVar1 = bcmp(scratch,auStack_118,0x100);
    if (iVar1 == 0) {
LAB_00168ea8:
      random_cb_called = iVar2 + 1;
      return;
    }
  }
  else {
    pcStack_120 = (code *)0x168ec1;
    random_cb_cold_1();
LAB_00168ec1:
    pcStack_120 = (code *)0x168ec6;
    random_cb_cold_2();
LAB_00168ec6:
    pcStack_120 = (code *)0x168ecb;
    random_cb_cold_3();
LAB_00168ecb:
    pcStack_120 = (code *)0x168ed0;
    random_cb_cold_5();
  }
  pcStack_120 = run_test_random_sync;
  random_cb_cold_6();
  puVar4 = auStack_320;
  puVar5 = (undefined1 *)0x0;
  pcStack_120 = (code *)buflen;
  iVar2 = uv_random(0,0,auStack_320,0x100,0xffffffff,0);
  if (iVar2 == -0x16) {
    puVar5 = (undefined1 *)0x0;
    iVar2 = uv_random(0,0,auStack_320,0xffffffffffffffff,0xffffffff,0);
    if (iVar2 != -7) goto LAB_00168fc1;
    memset(auStack_320,0,0x100);
    puVar5 = (undefined1 *)0x0;
    iVar2 = uv_random(0,0,auStack_320,0x100,0,0);
    if (iVar2 != 0) goto LAB_00168fc6;
    memset(auStack_220,0,0x100);
    iVar2 = bcmp(auStack_320,auStack_220,0x100);
    if (iVar2 != 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar4 = (undefined1 *)uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00168fd0;
    }
  }
  else {
    run_test_random_sync_cold_1();
LAB_00168fc1:
    run_test_random_sync_cold_2();
LAB_00168fc6:
    puVar4 = puVar5;
    run_test_random_sync_cold_3();
  }
  run_test_random_sync_cold_5();
LAB_00168fd0:
  run_test_random_sync_cold_4();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(puVar4,0);
  return;
}

Assistant:

static void random_cb(uv_random_t* req, int status, void* buf, size_t buflen) {
  char zero[sizeof(scratch)];

  memset(zero, 0, sizeof(zero));

  ASSERT(0 == status);
  ASSERT(buf == (void*) scratch);

  if (random_cb_called == 0) {
    ASSERT(buflen == 0);
    ASSERT(0 == memcmp(scratch, zero, sizeof(zero)));
  } else {
    ASSERT(buflen == sizeof(scratch));
    /* Buy a lottery ticket if you manage to trip this assertion. */
    ASSERT(0 != memcmp(scratch, zero, sizeof(zero)));
  }

  random_cb_called++;
}